

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::TrackIfSurrogatePair
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,codepoint_t codePoint,
          EncodedChar *location,uint32 consumptionLength)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar4;
  SurrogatePairTracker *this_00;
  TrackAllocData local_58;
  SurrogatePairTracker *local_30;
  SurrogatePairTracker *node;
  EncodedChar *pEStack_20;
  uint32 consumptionLength_local;
  EncodedChar *location_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPStack_10;
  codepoint_t codePoint_local;
  Parser<UTF8EncodingPolicyBase<false>,_false> *this_local;
  
  node._4_4_ = consumptionLength;
  pEStack_20 = location;
  location_local._4_4_ = codePoint;
  pPStack_10 = this;
  if (0x10ffff < codePoint) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x13d,"(codePoint < 0x110000)","codePoint < 0x110000");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pEStack_20 == (EncodedChar *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x13e,"(location != nullptr)","location != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (pEStack_20 == this->tempLocationOfSurrogatePair) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x13f,"(location != this->tempLocationOfSurrogatePair)",
                       "location != this->tempLocationOfSurrogatePair");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(location_local._4_4_);
  if (bVar2) {
    this->tempLocationOfSurrogatePair = pEStack_20;
    this->codePointAtTempLocation = location_local._4_4_;
  }
  else {
    bVar2 = Js::NumberUtilities::IsSurrogateUpperPart(location_local._4_4_);
    if ((bVar2) && (this->tempLocationOfSurrogatePair != (EncodedChar *)0x0)) {
      bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(this->codePointAtTempLocation);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x14a,
                           "(Js::NumberUtilities::IsSurrogateLowerPart(codePointAtTempLocation))",
                           "Js::NumberUtilities::IsSurrogateLowerPart(codePointAtTempLocation)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      node._4_4_ = ((int)pEStack_20 - (int)this->tempLocationOfSurrogatePair) + node._4_4_;
      location_local._4_4_ =
           Js::NumberUtilities::SurrogatePairAsCodePoint
                     (this->codePointAtTempLocation,location_local._4_4_);
      pEStack_20 = this->tempLocationOfSurrogatePair;
    }
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    this->codePointAtTempLocation = 0;
  }
  if (0xffff < location_local._4_4_) {
    this->positionAfterLastSurrogate = pEStack_20 + node._4_4_;
    this->valueOfLastSurrogate = location_local._4_4_;
    if (this->ctAllocator != (ArenaAllocator *)0x0) {
      pAVar4 = &this->ctAllocator->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_58,
                 (type_info *)
                 &Parser<UTF8EncodingPolicyBase<false>,false>::SurrogatePairTracker::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                 ,0x15d);
      pAVar4 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar4,&local_58);
      this_00 = (SurrogatePairTracker *)
                new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar4,0x3f67b0);
      SurrogatePairTracker::SurrogatePairTracker
                (this_00,pEStack_20,this->tempLocationOfRange,location_local._4_4_,node._4_4_,
                 (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits);
      local_30 = this_00;
      if (this->surrogatePairList == (SurrogatePairTracker *)0x0) {
        if (this->currentSurrogatePairNode != (SurrogatePairTracker *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x160,"(currentSurrogatePairNode == nullptr)",
                             "currentSurrogatePairNode == nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        this->surrogatePairList = local_30;
        this->currentSurrogatePairNode = local_30;
      }
      else {
        if (this->currentSurrogatePairNode == (SurrogatePairTracker *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x166,"(currentSurrogatePairNode != nullptr)",
                             "currentSurrogatePairNode != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        this->currentSurrogatePairNode->next = local_30;
        this->currentSurrogatePairNode = local_30;
      }
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>:: TrackIfSurrogatePair(codepoint_t codePoint,  const EncodedChar* location, uint32 consumptionLength)
    {
        Assert(codePoint < 0x110000);
        Assert(location != nullptr);
        Assert(location != this->tempLocationOfSurrogatePair);

        if (Js::NumberUtilities::IsSurrogateLowerPart(codePoint))
        {
            this->tempLocationOfSurrogatePair = location;
            this->codePointAtTempLocation = codePoint;
        }
        else
        {
            if(Js::NumberUtilities::IsSurrogateUpperPart(codePoint) && this->tempLocationOfSurrogatePair != nullptr)
            {
                Assert(Js::NumberUtilities::IsSurrogateLowerPart(codePointAtTempLocation));
                consumptionLength = (uint32)(location - this->tempLocationOfSurrogatePair) + consumptionLength;
                codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint(codePointAtTempLocation, codePoint);
                location = this->tempLocationOfSurrogatePair;
            }
            // At this point we can clear previous location, and then if codePoint is bigger than 0xFFFF store it, as we either received it or combined it above
            this->tempLocationOfSurrogatePair = nullptr;
            this->codePointAtTempLocation = 0;
        }

        if (codePoint > 0xFFFF)
        {
            this->positionAfterLastSurrogate = location + consumptionLength;
            this->valueOfLastSurrogate = codePoint;

            // When parsing without AST we aren't given an allocator. In addition, only the 2 lines above are used during Pass 0;
            // while the bottom is used during Pass 1 (which isn't done when ParseNoAST)
            if(this->ctAllocator != nullptr)
            {
                SurrogatePairTracker* node = Anew(this->ctAllocator, SurrogatePairTracker, location, this->tempLocationOfRange, codePoint, consumptionLength, this->m_cMultiUnits);
                if (surrogatePairList == nullptr)
                {
                    Assert(currentSurrogatePairNode == nullptr);
                    surrogatePairList = node;
                    currentSurrogatePairNode = node;
                }
                else
                {
                    Assert(currentSurrogatePairNode != nullptr);
                    currentSurrogatePairNode->next = node;
                    currentSurrogatePairNode = node;
                }
            }
        }
    }